

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

Lit __thiscall Minisat::Clause::subsumes(Clause *this,Clause *other)

{
  bool bVar1;
  Lit p;
  Lit *pLVar2;
  Lit *pLVar3;
  anon_struct_8_10_eb538618_for_header *in_RSI;
  anon_struct_8_10_eb538618_for_header *in_RDI;
  uint j;
  uint i;
  Lit *d;
  Lit *c;
  Lit ret;
  bool local_51;
  uint local_38;
  uint local_34;
  Lit local_1c;
  anon_struct_8_10_eb538618_for_header *local_18;
  int local_4;
  
  if ((SUB84(*in_RSI,4) >> 2 < SUB84(*in_RDI,4) >> 2) ||
     ((*(uint *)(&in_RDI[1].field_0x0 + ((ulong)*in_RDI >> 0x22) * 4) &
      (*(uint *)((long)&in_RSI[1].field_0x0 + ((ulong)*in_RSI >> 0x22) * 4) ^ 0xffffffff)) != 0)) {
    local_4 = -1;
  }
  else {
    local_1c.x = -2;
    local_18 = in_RSI;
    pLVar2 = operator_cast_to_Lit_((Clause *)in_RDI);
    pLVar3 = operator_cast_to_Lit_((Clause *)local_18);
    for (local_34 = 0; local_34 < SUB84(*in_RDI,4) >> 2; local_34 = local_34 + 1) {
      local_38 = 0;
      while( true ) {
        if (SUB84(*local_18,4) >> 2 <= local_38) {
          return (Lit)-1;
        }
        bVar1 = Lit::operator==(pLVar2 + local_34,(Lit)pLVar3[local_38].x);
        if (bVar1) goto LAB_00160434;
        bVar1 = Lit::operator==(&local_1c,(Lit)0xfffffffe);
        local_51 = false;
        if (bVar1) {
          p = operator~(pLVar3[local_38].x);
          local_51 = Lit::operator==(pLVar2 + local_34,p);
        }
        if (local_51 != false) break;
        local_38 = local_38 + 1;
      }
      local_1c.x = pLVar2[local_34].x;
LAB_00160434:
    }
    local_4 = local_1c.x;
  }
  return (Lit)local_4;
}

Assistant:

inline Lit Clause::subsumes(const Clause &other) const
{
    // if (other.size() < size() || (extra.abst & ~other.extra.abst) != 0)
    // if (other.size() < size() || (!learnt() && !other.learnt() && (extra.abst & ~other.extra.abst) != 0))
    assert(!header.learnt);
    assert(!other.header.learnt);
    assert(header.has_extra);
    assert(other.header.has_extra);
    if (other.header.size < header.size || (data[header.size].abs & ~other.data[other.header.size].abs) != 0)
        return lit_Error;

    Lit ret = lit_Undef;
    const Lit *c = (const Lit *)(*this);
    const Lit *d = (const Lit *)other;

    for (unsigned i = 0; i < header.size; i++) {
        // search for c[i] or ~c[i]
        for (unsigned j = 0; j < other.header.size; j++)
            if (c[i] == d[j])
                goto ok;
            else if (ret == lit_Undef && c[i] == ~d[j]) {
                ret = c[i];
                goto ok;
            }

        // did not find it
        return lit_Error;
    ok:;
    }

    return ret;
}